

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,
          cmGeneratorTarget *target)

{
  string *psVar1;
  allocator<char> local_22;
  undefined1 local_21;
  cmGeneratorTarget *local_20;
  cmGeneratorTarget *target_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  string *dir;
  
  local_21 = 0;
  local_20 = target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmLocalUnixMakefileGenerator3 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"CMakeFiles/",&local_22);
  std::allocator<char>::~allocator(&local_22);
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(local_20);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".dir");
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir = "CMakeFiles/";
  dir += target->GetName();
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}